

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::DiskSourceTree::GetLastErrorMessage_abi_cxx11_
          (string *__return_storage_ptr__,DiskSourceTree *this)

{
  DiskSourceTree *this_local;
  
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&this->last_error_message_);
  return __return_storage_ptr__;
}

Assistant:

string DiskSourceTree::GetLastErrorMessage() {
  return last_error_message_;
}